

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionController::SetAssetReissuance
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,Amount *amount,
          Script *locking_script,ByteData *asset_nonce,BlindFactor *blind_factor,
          BlindFactor *entropy,bool is_random_sort,bool is_remove_nonce)

{
  uint32_t in_ECX;
  Txid *in_RDX;
  long in_RSI;
  IssuanceParameter *in_RDI;
  Amount *in_R8;
  Script *in_R9;
  ByteData *in_stack_00000008;
  IssuanceParameter *in_stack_00000010;
  IssuanceParameter *in_stack_00000018;
  byte in_stack_00000020;
  byte in_stack_00000028;
  ConfidentialNonce confidential_asset_nonce;
  uint32_t txin_index;
  IssuanceParameter *param;
  IssuanceParameter *this_00;
  IssuanceParameter local_108;
  undefined1 local_95;
  ConfidentialNonce local_88;
  ConfidentialNonce local_60;
  uint32_t local_38;
  byte local_32;
  byte local_31;
  Script *local_30;
  Amount *local_28;
  
  local_31 = in_stack_00000020 & 1;
  local_32 = in_stack_00000028 & 1;
  this_00 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_38 = core::ConfidentialTransaction::GetTxInIndex
                       ((ConfidentialTransaction *)(in_RSI + 0x10),in_RDX,in_ECX);
  core::ConfidentialNonce::ConfidentialNonce(&local_60);
  if ((local_32 & 1) == 0) {
    core::ConfidentialNonce::ConfidentialNonce(&local_88,in_stack_00000008);
    core::ConfidentialNonce::operator=(&local_60,&local_88);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x586bdf);
  }
  local_95 = 0;
  core::IssuanceParameter::IssuanceParameter(this_00);
  core::ConfidentialTransaction::SetAssetReissuance
            (&local_108,(ConfidentialTransaction *)(in_RSI + 0x10),local_38,local_28,local_30,
             &local_60,&in_stack_00000010->entropy,&in_stack_00000018->entropy);
  core::IssuanceParameter::operator=(in_stack_00000018,in_stack_00000010);
  core::IssuanceParameter::~IssuanceParameter(in_stack_00000018);
  if ((local_31 & 1) != 0) {
    RandomSortTxOut((ConfidentialTransactionController *)0x586cb1);
  }
  local_95 = 1;
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x586d14);
  return in_RDI;
}

Assistant:

IssuanceParameter ConfidentialTransactionController::SetAssetReissuance(
    const Txid& txid, uint32_t vout, const Amount& amount,
    const Script& locking_script, const ByteData& asset_nonce,
    const BlindFactor& blind_factor, const BlindFactor& entropy,
    bool is_random_sort, bool is_remove_nonce) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);

  ConfidentialNonce confidential_asset_nonce;
  if (!is_remove_nonce) {
    confidential_asset_nonce = ConfidentialNonce(asset_nonce);
  }

  IssuanceParameter param;
  param = transaction_.SetAssetReissuance(
      txin_index, amount, locking_script, confidential_asset_nonce,
      blind_factor, entropy);

  if (is_random_sort) {
    RandomSortTxOut();
  }
  return param;
}